

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej(secp256k1_ge *r,secp256k1_gej *a)

{
  secp256k1_fe *in_RSI;
  void *in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_gej_verify((secp256k1_gej *)0x1052a8);
  *(int *)((long)in_RDI + 0x50) = (int)in_RSI[3].n[0];
  secp256k1_fe_impl_inv(in_RSI,in_stack_ffffffffffffffe8);
  secp256k1_fe_impl_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x1052fa);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x10530e);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x10532a);
  secp256k1_fe_impl_set_int(in_RSI + 2,1);
  memcpy(in_RDI,in_RSI,0x28);
  memcpy((void *)((long)in_RDI + 0x28),in_RSI + 1,0x28);
  secp256k1_gej_verify((secp256k1_gej *)0x105377);
  secp256k1_ge_verify((secp256k1_ge *)0x105381);
  return;
}

Assistant:

static void secp256k1_ge_set_gej(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    secp256k1_fe_inv(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    r->x = a->x;
    r->y = a->y;

    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(r);
}